

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

int get_comp_group_idx_context(MACROBLOCKD *xd)

{
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *mbmi_00;
  int iVar1;
  long in_RDI;
  int left_ctx;
  int above_ctx;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  int local_24;
  uint local_20;
  uint local_1c;
  
  mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ed0);
  mbmi_00 = *(MB_MODE_INFO **)(in_RDI + 0x1ec8);
  local_1c = 0;
  local_20 = 0;
  if (mbmi != (MB_MODE_INFO *)0x0) {
    iVar1 = has_second_ref(mbmi);
    if (iVar1 == 0) {
      if (mbmi->ref_frame[0] == '\a') {
        local_1c = 3;
      }
    }
    else {
      local_1c = (uint)((byte)((ushort)*(undefined2 *)&mbmi->field_0xa7 >> 8) & 1);
    }
  }
  if (mbmi_00 != (MB_MODE_INFO *)0x0) {
    iVar1 = has_second_ref(mbmi_00);
    if (iVar1 == 0) {
      if (mbmi_00->ref_frame[0] == '\a') {
        local_20 = 3;
      }
    }
    else {
      local_20 = (uint)((byte)((ushort)*(undefined2 *)&mbmi_00->field_0xa7 >> 8) & 1);
    }
  }
  if (local_1c + local_20 < 6) {
    local_24 = local_1c + local_20;
  }
  else {
    local_24 = 5;
  }
  return local_24;
}

Assistant:

static inline int get_comp_group_idx_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_ctx = 0, left_ctx = 0;

  if (above_mi) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->comp_group_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 3;
  }
  if (left_mi) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->comp_group_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 3;
  }

  return AOMMIN(5, above_ctx + left_ctx);
}